

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O2

void __thiscall SceneRender::printBuffers(SceneRender *this)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(this->buffersFbo).
                            super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->buffersFbo).
                            super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"uniform sampler2D u_sceneBuffer");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1,";");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void SceneRender::printBuffers() {
    for (size_t i = 0; i < buffersFbo.size(); i++)
        std::cout << "uniform sampler2D u_sceneBuffer" << i << ";" << std::endl;
}